

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_r20.cpp
# Opt level: O3

void __thiscall r20_order_Test::TestBody(r20_order_Test *this)

{
  void *pvVar1;
  ulong uVar2;
  char *message;
  undefined8 *puVar3;
  size_t unit_count;
  allocator local_8a;
  allocator local_89;
  internal local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  size_t local_38;
  
  local_38 = 0;
  pvVar1 = units::detail::r20rawData(&local_38);
  if (1 < local_38) {
    puVar3 = (undefined8 *)((long)pvVar1 + 0x38);
    uVar2 = 1;
    do {
      std::__cxx11::string::string((string *)&local_78,(char *)puVar3[-4],&local_89);
      std::__cxx11::string::string((string *)&local_58,(char *)*puVar3,&local_8a);
      testing::internal::CmpHelperLT<std::__cxx11::string,std::__cxx11::string>
                (local_88,"std::string(std::get<0>(r20data[ii - 1]))",
                 "std::string(std::get<0>(r20data[ii]))",&local_78,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_78);
        message = "";
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = (local_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_r20.cpp"
                   ,0x1a,message);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_78);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
        if ((long *)local_78._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_78._M_dataplus._M_p + 8))();
        }
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
      uVar2 = uVar2 + 1;
      puVar3 = puVar3 + 4;
    } while (uVar2 < local_38);
  }
  return;
}

Assistant:

TEST(r20, order)
{
    std::size_t unit_count{0};
    const void* r20 = units::detail::r20rawData(unit_count);
    const auto* r20data = reinterpret_cast<const unitD*>(r20);
    for (size_t ii = 1; ii < unit_count; ++ii) {
        EXPECT_LT(
            std::string(std::get<0>(r20data[ii - 1])),
            std::string(std::get<0>(r20data[ii])));
    }
}